

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_suite.cpp
# Opt level: O0

void __thiscall reader_url_suite::test_path_absolute_one::test_method(test_path_absolute_one *this)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  view_type *pvVar4;
  undefined1 local_3b2;
  undefined1 local_3b1;
  basic_cstring<const_char> local_3b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_3a0;
  basic_cstring<const_char> local_378;
  basic_cstring<const_char> local_368;
  basic_cstring<const_char> local_358;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_348;
  basic_cstring<const_char> local_320;
  basic_cstring<const_char> local_310;
  undefined4 local_300;
  value local_2fc;
  basic_cstring<const_char> local_2f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_2e8;
  basic_cstring<const_char> local_2c0;
  basic_cstring<const_char> local_2b0;
  undefined4 local_2a0;
  value local_29c;
  basic_cstring<const_char> local_298;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_288;
  basic_cstring<const_char> local_260;
  basic_cstring<const_char> local_250;
  undefined4 local_240;
  value local_23c;
  basic_cstring<const_char> local_238;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_228;
  basic_cstring<const_char> local_200;
  basic_cstring<const_char> local_1f0;
  undefined1 local_1da;
  undefined1 local_1d9;
  basic_cstring<const_char> local_1d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1c8;
  basic_cstring<const_char> local_1a0;
  basic_cstring<const_char> local_190;
  basic_cstring<const_char> local_180;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_170;
  basic_cstring<const_char> local_148;
  basic_cstring<const_char> local_138;
  undefined4 local_124;
  value local_120 [4];
  basic_cstring<const_char> local_110;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_100;
  basic_cstring<const_char> local_d8;
  basic_cstring<const_char> local_c8;
  basic_string_ref<char,_std::char_traits<char>_> local_b8;
  undefined1 local_a8 [8];
  url reader;
  char input [13];
  test_path_absolute_one *this_local;
  
  stack0xffffffffffffffe3 = 0x2f3a656d65686373;
  boost::basic_string_ref<char,_std::char_traits<char>_>::basic_string_ref
            (&local_b8,&reader.path_reader.field_0x33);
  trial::url::reader::basic_url<char>::basic_url((basic_url<char> *)local_a8,&local_b8);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_c8,0xa0,&local_d8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_100,plVar3,(char (*) [1])0x1b56e9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_110,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp"
               ,0x5f);
    local_120[0] = trial::url::reader::base<char,_trial::url::reader::basic_url>::subcode
                             ((base<char,_trial::url::reader::basic_url> *)local_a8);
    local_124 = 2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::subcode::value,trial::url::token::subcode::value>
              (&local_100,&local_110,0xa0,2,2,local_120,"reader.subcode()",&local_124,
               "url::token::subcode::scheme");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_100);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_138,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_148);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_138,0xa1,&local_148);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_170,plVar3,(char (*) [1])0x1b56e9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_180,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp"
               ,0x5f);
    pvVar4 = trial::url::reader::base<char,_trial::url::reader::basic_url>::literal
                       ((base<char,_trial::url::reader::basic_url> *)local_a8);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[7]>
              (&local_170,&local_180,0xa1,2,2,pvVar4,"reader.literal()","scheme","\"scheme\"");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_170);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_190,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_190,0xa2,&local_1a0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1c8,plVar3,(char (*) [1])0x1b56e9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp"
               ,0x5f);
    local_1d9 = trial::url::reader::base<char,_trial::url::reader::basic_url>::next
                          ((base<char,_trial::url::reader::basic_url> *)local_a8);
    local_1da = 1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (&local_1c8,&local_1d8,0xa2,2,2,&local_1d9,"reader.next()",&local_1da,"true");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_200);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1f0,0xa3,&local_200);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_228,plVar3,(char (*) [1])0x1b56e9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_238,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp"
               ,0x5f);
    local_23c = trial::url::reader::base<char,_trial::url::reader::basic_url>::category
                          ((base<char,_trial::url::reader::basic_url> *)local_a8);
    local_240 = 3;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::category::value,trial::url::token::category::value>
              (&local_228,&local_238,0xa3,2,2,&local_23c,"reader.category()",&local_240,
               "url::token::category::path");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_228);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_250,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_260);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_250,0xa4,&local_260);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_288,plVar3,(char (*) [1])0x1b56e9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_298,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp"
               ,0x5f);
    local_29c = trial::url::reader::base<char,_trial::url::reader::basic_url>::code
                          ((base<char,_trial::url::reader::basic_url> *)local_a8);
    local_2a0 = 6;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::code::value,trial::url::token::code::value>
              (&local_288,&local_298,0xa4,2,2,&local_29c,"reader.code()",&local_2a0,
               "url::token::code::path_segment");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_288);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2b0,0xa5,&local_2c0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_2e8,plVar3,(char (*) [1])0x1b56e9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp"
               ,0x5f);
    local_2fc = trial::url::reader::base<char,_trial::url::reader::basic_url>::subcode
                          ((base<char,_trial::url::reader::basic_url> *)local_a8);
    local_300 = 8;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,trial::url::token::subcode::value,trial::url::token::subcode::value>
              (&local_2e8,&local_2f8,0xa5,2,2,&local_2fc,"reader.subcode()",&local_300,
               "url::token::subcode::path_segment");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_2e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_310,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_320);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_310,0xa6,&local_320);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_348,plVar3,(char (*) [1])0x1b56e9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_358,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp"
               ,0x5f);
    pvVar4 = trial::url::reader::base<char,_trial::url::reader::basic_url>::literal
                       ((base<char,_trial::url::reader::basic_url> *)local_a8);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::basic_string_ref<char,std::char_traits<char>>,char[5]>
              (&local_348,&local_358,0xa6,2,2,pvVar4,"reader.literal()","path","\"path\"");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_348);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_368,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_378);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_368,0xa7,&local_378);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_3a0,plVar3,(char (*) [1])0x1b56e9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp"
               ,0x5f);
    local_3b1 = trial::url::reader::base<char,_trial::url::reader::basic_url>::next
                          ((base<char,_trial::url::reader::basic_url> *)local_a8);
    local_3b2 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (&local_3a0,&local_3b0,0xa7,2,2,&local_3b1,"reader.next()",&local_3b2,"false");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_3a0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_path_absolute_one)
{
    const char input[] = "scheme:/path";
    url::reader::url reader(input);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::scheme);
    BOOST_REQUIRE_EQUAL(reader.literal(), "scheme");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.category(), url::token::category::path);
    BOOST_REQUIRE_EQUAL(reader.code(), url::token::code::path_segment);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::path_segment);
    BOOST_REQUIRE_EQUAL(reader.literal(), "path");
    BOOST_REQUIRE_EQUAL(reader.next(), false);
}